

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O0

void __thiscall CppCNN::print_info(CppCNN *this,bool verbose)

{
  ostream *poVar1;
  bool verbose_local;
  CppCNN *this_local;
  
  if (this->__epoch_batch % 100 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\r");
    poVar1 = std::operator<<(poVar1,"print_info");
    poVar1 = std::operator<<(poVar1,":: ");
    poVar1 = std::operator<<(poVar1,"step: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->__epoch_batch);
    poVar1 = std::operator<<(poVar1,"/");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->__epoch_max * this->__examples_num) / this->__mini_batch_size)
    ;
    poVar1 = std::operator<<(poVar1,", loss: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->__loss);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"learning rate: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->__learn_rate);
    std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  }
  if ((this->__epoch_batch * this->__mini_batch_size) % this->__examples_num == 0) {
    this->__epoch = this->__epoch + 1;
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"print_info");
    poVar1 = std::operator<<(poVar1,":: ");
    poVar1 = std::operator<<(poVar1,"epoch: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->__epoch);
    poVar1 = std::operator<<(poVar1,"/");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->__epoch_max);
    poVar1 = std::operator<<(poVar1,", loss: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->__loss);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"learning rate: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->__learn_rate);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CppCNN::print_info(bool verbose) {
	if (__epoch_batch % 100 == 0) {
		cout << "\r" << __FUNCTION__ << ":: " << "step: " << __epoch_batch << "/" << __epoch_max * __examples_num / __mini_batch_size
			<< ", loss: " << __loss << ", " << "learning rate: " << __learn_rate << flush;
	}

	if ((__epoch_batch * __mini_batch_size) % __examples_num == 0) {
		__epoch++;

		//if (__learn_rate_decay_enabled) decay_learn_rate();

		cout << endl << __FUNCTION__ << ":: " << "epoch: " << __epoch << "/" << __epoch_max
			<< ", loss: " << __loss << ", " << "learning rate: " << __learn_rate << endl;
	}
}